

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O2

void Omega_h::transfer_inherit_refine<long>
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents,string *name)

{
  Alloc *pAVar1;
  Int IVar2;
  int iVar3;
  Int IVar4;
  Tag<long> *this;
  LO n;
  size_t sVar5;
  LOs edge_doms2doms;
  LOs edges2edge_doms;
  Read<signed_char> dom_data;
  Write<signed_char> prod_data;
  Graph edges2doms;
  type f;
  Write<int> local_80;
  Write<int> local_70;
  Write<int> local_60;
  Write<int> local_50;
  Write<long> local_40;
  
  this = Mesh::get_tag<long>(old_mesh,prod_dim,
                             (string *)same_ents2new_ents.write_.shared_alloc_.alloc);
  IVar2 = TagBase::ncomps(&this->super_TagBase);
  iVar3 = Read<int>::last((Read<signed_char> *)keys2prods);
  std::__cxx11::string::string((string *)&f,"",(allocator *)&edges2doms);
  Write<long>::Write((Write<long> *)&prod_data,iVar3 * IVar2,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  pAVar1 = (keys2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar5 = pAVar1->size;
  }
  else {
    sVar5 = (ulong)pAVar1 >> 3;
  }
  n = (LO)(sVar5 >> 2);
  if (0 < prod_dim) {
    Mesh::get_array<long>((Mesh *)&dom_data,(Int)old_mesh,(string *)(ulong)(uint)prod_dim);
    Mesh::ask_graph(&edges2doms,old_mesh,1,prod_dim);
    Write<int>::Write(&edges2edge_doms.write_,(Write<int> *)&edges2doms);
    Write<int>::Write(&edge_doms2doms.write_,&edges2doms.ab2b.write_);
    Write<int>::Write((Write<int> *)&f,&keys2edges->write_);
    Write<int>::Write(&f.keys2prods.write_,&keys2prods->write_);
    Write<int>::Write(&f.edges2edge_doms.write_,&edges2edge_doms.write_);
    Write<int>::Write(&f.edge_doms2doms.write_,&edge_doms2doms.write_);
    f.ncomps = IVar2;
    Write<long>::Write((Write<int> *)&f.prod_data,(Write<int> *)&prod_data);
    Write<long>::Write((Write<int> *)&f.dom_data,(Write<int> *)&dom_data);
    parallel_for<Omega_h::transfer_inherit_refine<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              (n,&f,"transfer_inherit_refine(pairs)");
    transfer_inherit_refine<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)&f);
    Write<int>::~Write(&edge_doms2doms.write_);
    Write<int>::~Write(&edges2edge_doms.write_);
    Graph::~Graph(&edges2doms);
    Write<long>::~Write((Write<long> *)&dom_data);
  }
  IVar4 = Mesh::dim(old_mesh);
  if (prod_dim < IVar4) {
    Mesh::get_array<long>((Mesh *)&dom_data,(Int)old_mesh,(string *)(ulong)(prod_dim + 1U));
    Mesh::ask_graph(&edges2doms,old_mesh,1,prod_dim + 1U);
    Write<int>::Write(&edges2edge_doms.write_,(Write<int> *)&edges2doms);
    Write<int>::Write(&edge_doms2doms.write_,&edges2doms.ab2b.write_);
    Write<int>::Write((Write<int> *)&f,&keys2edges->write_);
    Write<int>::Write(&f.keys2prods.write_,&edges2edge_doms.write_);
    Write<int>::Write(&f.edges2edge_doms.write_,&keys2prods->write_);
    Write<int>::Write(&f.edge_doms2doms.write_,&edge_doms2doms.write_);
    f.ncomps = IVar2;
    Write<long>::Write((Write<int> *)&f.prod_data,(Write<int> *)&prod_data);
    Write<long>::Write((Write<int> *)&f.dom_data,(Write<int> *)&dom_data);
    parallel_for<Omega_h::transfer_inherit_refine<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_2_>
              (n,(type *)&f,"transfer_inherit_refine(cuts)");
    transfer_inherit_refine<long>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#2}::~basic_string((_lambda_int__2_ *)&f);
    Write<int>::~Write(&edge_doms2doms.write_);
    Write<int>::~Write(&edges2edge_doms.write_);
    Graph::~Graph(&edges2doms);
    Write<long>::~Write((Write<long> *)&dom_data);
  }
  Write<int>::Write(&local_50,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc);
  Write<int>::Write(&local_60,(Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
  Write<int>::Write(&local_70,&prods2new_ents->write_);
  Write<long>::Write(&local_80,(Write<int> *)&prod_data);
  Read<long>::Read((Read<signed_char> *)&local_40,(Write<long> *)&local_80);
  transfer_common<long>
            (old_mesh,new_mesh,prod_dim,(LOs *)&local_50,(LOs *)&local_60,(LOs *)&local_70,
             &this->super_TagBase,(Read<signed_char> *)&local_40);
  Write<long>::~Write(&local_40);
  Write<long>::~Write((Write<long> *)&local_80);
  Write<int>::~Write(&local_70);
  Write<int>::~Write(&local_60);
  Write<int>::~Write(&local_50);
  Write<long>::~Write((Write<long> *)&prod_data);
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, std::string const& name) {
  auto old_tag = old_mesh->get_tag<T>(prod_dim, name);
  auto ncomps = old_tag->ncomps();
  auto nprods = keys2prods.last();
  auto prod_data = Write<T>(nprods * ncomps);
  auto nkeys = keys2edges.size();
  /* transfer pairs */
  if (prod_dim > VERT) {
    auto dom_dim = prod_dim;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto prod = keys2prods[key];
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int pair = 0; pair < 2; ++pair) {
          for (Int comp = 0; comp < ncomps; ++comp) {
            prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
          }
          ++prod;
        }
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(pairs)");
  }
  if (prod_dim < old_mesh->dim()) {
    auto dom_dim = prod_dim + 1;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto ndoms = edges2edge_doms[edge + 1] - edges2edge_doms[edge];
      auto prod = keys2prods[key + 1] - ndoms;
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int comp = 0; comp < ncomps; ++comp) {
          prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
        }
        ++prod;
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(cuts)");
  }
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, Read<T>(prod_data));
}